

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  char *in_RSI;
  long *in_R8;
  long in_FS_OFFSET;
  int i;
  char **azVals;
  int nCol;
  int callbackIsInit;
  char **azCols;
  int rc;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  sqlite3 *in_stack_ffffffffffffff98;
  int nBytes;
  char *pcVar4;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar5;
  char *local_30;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = 0;
  pcVar4 = (char *)0x0;
  nBytes = -0x55555556;
  iVar3 = sqlite3SafetyCheckOk
                    ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar3 == 0) {
    local_1c = sqlite3MisuseError(0);
  }
  else {
    local_30 = in_RSI;
    if (in_RSI == (char *)0x0) {
      local_30 = "";
    }
    sqlite3_mutex_enter((sqlite3_mutex *)0x13a8c4);
    sqlite3Error((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
    while( true ) {
      uVar2 = in_stack_ffffffffffffff90 & 0xffffff;
      if (iVar5 == 0) {
        uVar2 = CONCAT13(*local_30 != '\0',(int3)in_stack_ffffffffffffff90);
      }
      in_stack_ffffffffffffff90 = uVar2;
      if ((char)(in_stack_ffffffffffffff90 >> 0x18) == '\0') break;
      in_stack_ffffffffffffff98 = (sqlite3 *)0x0;
      iVar5 = sqlite3_prepare_v2((sqlite3 *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),pcVar4,nBytes,
                                 (sqlite3_stmt **)0x0,
                                 (char **)CONCAT44(in_stack_ffffffffffffff94,
                                                   in_stack_ffffffffffffff90));
      if (iVar5 == 0) {
        local_30 = &DAT_aaaaaaaaaaaaaaaa;
      }
    }
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_1c = sqlite3ApiExit((sqlite3 *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
    if ((local_1c == 0) || (in_R8 == (long *)0x0)) {
      if (in_R8 != (long *)0x0) {
        *in_R8 = 0;
      }
    }
    else {
      sqlite3_errmsg(in_stack_ffffffffffffff98);
      pcVar4 = sqlite3DbStrDup(in_stack_ffffffffffffff98,
                               (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                              );
      *in_R8 = (long)pcVar4;
      if (*in_R8 == 0) {
        local_1c = 7;
        sqlite3Error((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
      }
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x13ac64);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol = 0;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }
    callbackIsInit = 0;

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc ||
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          nCol = sqlite3_column_count(pStmt);
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}